

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derSIDDec(char *oid,u32 val)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  u32 t;
  
  lVar5 = -1;
  uVar2 = val;
  do {
    lVar4 = lVar5;
    lVar5 = lVar4 + 1;
    bVar1 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar1);
  if (oid != (char *)0x0) {
    oid[lVar5] = (char)val + (char)(val / 10) * -10 | 0x30;
    uVar3 = (ulong)val;
    for (; lVar5 != 0; lVar5 = lVar5 + -1) {
      oid[lVar5 + -1] = (char)(uVar3 / 10) + (char)((uVar3 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
      uVar3 = uVar3 / 10;
    }
  }
  return lVar4 + 2;
}

Assistant:

static size_t derSIDDec(char* oid, u32 val)
{
	size_t count = 0, pos;
	u32 t = val;
	// число символов для val
	do
		t /= 10, count++;
	while (t > 0);
	// декодирование
	if (oid)
	{
		ASSERT(memIsValid(oid, count));
		pos = count - 1;
		oid[pos] = (t = val) % 10 + '0';
		while (pos--)
			t /= 10, oid[pos] = t % 10 + '0';
	}
	return count;
}